

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O2

bool __thiscall TestRange<bool>::getEntry(TestRange<bool> *this,size_t idx)

{
  RangeType RVar1;
  bool bVar2;
  double dVar3;
  undefined1 auVar4 [16];
  reference rVar5;
  
  RVar1 = this->type;
  if (RVar1 == EXPONENTIAL) {
    bVar2 = this->begin;
    auVar4._8_4_ = (int)(idx >> 0x20);
    auVar4._0_8_ = idx;
    auVar4._12_4_ = 0x45300000;
    dVar3 = pow((double)(int)this->step,
                (auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)idx) - 4503599627370496.0));
    bVar2 = (long)(dVar3 * (double)(int)bVar2) == 0;
  }
  else if (RVar1 == LINEAR) {
    bVar2 = this->step * idx + (ulong)this->begin == 0;
  }
  else {
    if (RVar1 != ARRAY) {
      return this->begin;
    }
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->array,idx);
    bVar2 = (*rVar5._M_p & rVar5._M_mask) == 0;
  }
  return !bVar2;
}

Assistant:

T getEntry(size_t idx) {
        if (type == RangeType::ARRAY) {
            return (T)(array[idx]);
        } else if (type == RangeType::LINEAR) {
            return (T)(begin + step * idx);
        } else if (type == RangeType::EXPONENTIAL) {
            ssize_t _begin = begin;
            ssize_t _step = step;
            ssize_t _ret = (ssize_t)( _begin * std::pow(_step, idx) );
            return (T)(_ret);
        }

        return begin;
    }